

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize_unittest.cc
# Opt level: O3

int GetStackConsumption(char *alt_stack)

{
  bool bVar1;
  int i_1;
  uint uVar2;
  int i;
  long lVar3;
  int local_14 [2];
  int x;
  
  bVar1 = StackGrowsDown(local_14);
  if (bVar1) {
    lVar3 = 0;
    do {
      if (alt_stack[lVar3] != 'U') {
        return 0x1fa0 - (int)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x1fa0);
  }
  else {
    uVar2 = 0x1f9f;
    do {
      if (alt_stack[uVar2] != 'U') {
        return uVar2;
      }
      bVar1 = uVar2 != 0;
      uVar2 = uVar2 - 1;
    } while (bVar1);
  }
  return -1;
}

Assistant:

static int GetStackConsumption(const char* alt_stack) {
  int x;
  if (StackGrowsDown(&x)) {
    for (int i = 0; i < kAlternateStackSize; i++) {
      if (alt_stack[i] != kAlternateStackFillValue) {
        return (kAlternateStackSize - i);
      }
    }
  } else {
    for (int i = (kAlternateStackSize - 1); i >= 0; i--) {
      if (alt_stack[i] != kAlternateStackFillValue) {
        return i;
      }
    }
  }
  return -1;
}